

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

enable_if_t<_detail::move_never<InitialState<>_>::value,_InitialState<>_> * __thiscall
pybind11::move<InitialState<double>>
          (enable_if_t<_detail::move_never<InitialState<>_>::value,_InitialState<>_>
           *__return_storage_ptr__,pybind11 *this,object *obj)

{
  int iVar1;
  cast_error *this_00;
  itype *piVar2;
  handle *handle;
  make_caster<InitialState<>_> local_118;
  undefined1 local_fa;
  undefined1 local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  PyObject *local_c8;
  str local_c0;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  detail *local_18;
  object *obj_local;
  InitialState<double> *ret;
  
  local_18 = (detail *)this;
  obj_local = (object *)__return_storage_ptr__;
  iVar1 = detail::object_api<pybind11::handle>::ref_count((object_api<pybind11::handle> *)this);
  if (iVar1 < 2) {
    local_fa = 0;
    detail::load_type<InitialState<double>>(&local_118,local_18,handle);
    piVar2 = detail::type_caster_base::operator_cast_to_InitialState_
                       ((type_caster_base *)&local_118);
    InitialState<double>::InitialState(__return_storage_ptr__,piVar2);
    return __return_storage_ptr__;
  }
  local_f9 = 1;
  this_00 = (cast_error *)__cxa_allocate_exception(0x10);
  local_c8 = (PyObject *)
             detail::object_api<pybind11::handle>::get_type
                       ((object_api<pybind11::handle> *)local_18);
  str::str(&local_c0,(handle)local_c8);
  str::operator_cast_to_string(&local_b8,&local_c0);
  std::operator+(&local_98,"Unable to move from Python ",&local_b8);
  std::operator+(&local_78,&local_98," instance to C++ ");
  type_id<InitialState<double>>();
  std::operator+(&local_58,&local_78,&local_f8);
  std::operator+(&local_38,&local_58," instance: instance has multiple references");
  cast_error::runtime_error(this_00,&local_38);
  local_f9 = 0;
  __cxa_throw(this_00,&cast_error::typeinfo,cast_error::~cast_error);
}

Assistant:

detail::enable_if_t<!detail::move_never<T>::value, T> move(object &&obj) {
    if (obj.ref_count() > 1)
#if defined(NDEBUG)
        throw cast_error("Unable to cast Python instance to C++ rvalue: instance has multiple references"
            " (compile in debug mode for details)");
#else
        throw cast_error("Unable to move from Python " + (std::string) str(obj.get_type()) +
                " instance to C++ " + type_id<T>() + " instance: instance has multiple references");
#endif

    // Move into a temporary and return that, because the reference may be a local value of `conv`
    T ret = std::move(detail::load_type<T>(obj).operator T&());
    return ret;
}